

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

bool flatbuffers::ReadEnvironmentVariable(char *var_name,string *_value)

{
  char *__s;
  size_t sVar1;
  long *local_40 [2];
  long local_30 [2];
  
  __s = getenv(var_name);
  if (_value != (string *)0x0 && __s != (char *)0x0) {
    local_40[0] = local_30;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,__s,__s + sVar1);
    std::__cxx11::string::operator=((string *)_value,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return __s != (char *)0x0;
}

Assistant:

bool ReadEnvironmentVariable(const char *var_name, std::string *_value) {
#ifdef _MSC_VER
  __pragma(warning(disable : 4996));  // _CRT_SECURE_NO_WARNINGS
#endif
  auto env_str = std::getenv(var_name);
  if (!env_str) return false;
  if (_value) *_value = std::string(env_str);
  return true;
}